

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

Read<double> __thiscall
Omega_h::interleave<double>
          (Omega_h *this,
          vector<Omega_h::Read<double>,_std::allocator<Omega_h::Read<double>_>_> *arrays)

{
  pointer pRVar1;
  Alloc *pAVar2;
  pointer pRVar3;
  void *in_RDX;
  ulong uVar4;
  void *extraout_RDX;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int n;
  size_t sVar8;
  Read<double> RVar9;
  Write<double> out;
  vector<Omega_h::Read<double>,_std::allocator<Omega_h::Read<double>_>_> *__range2;
  type f;
  value_type array;
  Write<double> local_a0;
  Alloc *local_90;
  ulong local_88;
  vector<Omega_h::Read<double>,_std::allocator<Omega_h::Read<double>_>_> *local_80;
  Write<signed_char> local_78;
  undefined1 local_68 [24];
  Write<double> local_50;
  Write<double> local_40;
  
  pRVar3 = (arrays->
           super__Vector_base<Omega_h::Read<double>,_std::allocator<Omega_h::Read<double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (arrays->
           super__Vector_base<Omega_h::Read<double>,_std::allocator<Omega_h::Read<double>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pRVar3 == pRVar1) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    uVar6 = (ulong)((long)pRVar1 - (long)pRVar3) >> 4;
    pAVar2 = (pRVar3->write_).shared_alloc_.alloc;
    if (((ulong)pAVar2 & 1) == 0) {
      sVar8 = pAVar2->size;
    }
    else {
      sVar8 = (ulong)pAVar2 >> 3;
    }
    while (n = (int)(sVar8 >> 3), local_80 = arrays, pRVar3 != pRVar1) {
      pAVar2 = (pRVar3->write_).shared_alloc_.alloc;
      if (((ulong)pAVar2 & 1) == 0) {
        uVar4 = pAVar2->size;
      }
      else {
        uVar4 = (ulong)pAVar2 >> 3;
      }
      pRVar3 = pRVar3 + 1;
      if ((int)(uVar4 >> 3) != n) {
        fail("assertion %s failed at %s +%d\n","array.size() == array_size",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
             ,0x1b3);
      }
    }
    std::__cxx11::string::string((string *)local_68,"",(allocator *)&local_40);
    local_90 = (Alloc *)this;
    Write<double>::Write(&local_a0,n * (int)uVar6,(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
    lVar7 = 0;
    uVar4 = 0;
    if (0 < (int)uVar6) {
      uVar4 = uVar6 & 0xffffffff;
    }
    local_88 = uVar6;
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      Write<double>::Write
                (&local_40,
                 (Write<double> *)
                 ((long)&(((local_80->
                           super__Vector_base<Omega_h::Read<double>,_std::allocator<Omega_h::Read<double>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->write_).shared_alloc_.alloc
                 + lVar7));
      Write<double>::Write((Write<double> *)local_68,&local_a0);
      local_68._16_4_ = (undefined4)local_88;
      local_68._20_4_ = (undefined4)uVar5;
      Write<double>::Write(&local_50,&local_40);
      parallel_for<Omega_h::interleave<double>(std::vector<Omega_h::Read<double>,std::allocator<Omega_h::Read<double>>>)::_lambda(int)_1_>
                (n,(type *)local_68,"interleave");
      interleave<double>(std::vector<Omega_h::Read<double>,std::allocator<Omega_h::Read<double>>>)::
      {lambda(int)#1}::~vector((_lambda_int__1_ *)local_68);
      Write<double>::~Write(&local_40);
      lVar7 = lVar7 + 0x10;
    }
    Write<double>::Write(&local_78,(Write<signed_char> *)&local_a0);
    this = (Omega_h *)local_90;
    Read<double>::Read((Read<signed_char> *)local_90,(Write<double> *)&local_78);
    Write<double>::~Write((Write<double> *)&local_78);
    Write<double>::~Write(&local_a0);
    in_RDX = extraout_RDX;
  }
  RVar9.write_.shared_alloc_.direct_ptr = in_RDX;
  RVar9.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<double>)RVar9.write_.shared_alloc_;
}

Assistant:

Read<T> interleave(std::vector<Read<T>> arrays) {
  if (arrays.empty()) return Read<T>();
  auto narrays = LO(arrays.size());
  auto array_size = arrays.front().size();
  for (auto& array : arrays) OMEGA_H_CHECK(array.size() == array_size);
  auto out_size = narrays * array_size;
  auto out = Write<T>(out_size);
  for (LO i = 0; i < narrays; ++i) {
    auto array = arrays[std::size_t(i)];
    auto f = OMEGA_H_LAMBDA(LO j) { out[j * narrays + i] = array[j]; };
    parallel_for(array_size, f, "interleave");
  }
  return out;
}